

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

uint8 * google::protobuf::io::CodedOutputStream::WriteVarint32FallbackToArray
                  (uint32 value,uint8 *target)

{
  uint8 *target_local;
  uint32 value_local;
  uint8 *local_10;
  
  *target = (byte)value | 0x80;
  if (value < 0x80) {
    *target = *target & 0x7f;
    local_10 = target + 1;
  }
  else {
    target[1] = (byte)(value >> 7) | 0x80;
    if (value < 0x4000) {
      target[1] = target[1] & 0x7f;
      local_10 = target + 2;
    }
    else {
      target[2] = (byte)(value >> 0xe) | 0x80;
      if (value < 0x200000) {
        target[2] = target[2] & 0x7f;
        local_10 = target + 3;
      }
      else {
        target[3] = (byte)(value >> 0x15) | 0x80;
        if (value < 0x10000000) {
          target[3] = target[3] & 0x7f;
          local_10 = target + 4;
        }
        else {
          target[4] = (byte)(value >> 0x1c);
          local_10 = target + 5;
        }
      }
    }
  }
  return local_10;
}

Assistant:

uint8* CodedOutputStream::WriteVarint32FallbackToArray(
    uint32 value, uint8* target) {
  return WriteVarint32FallbackToArrayInline(value, target);
}